

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O1

void __thiscall
kj::MainBuilder::MainImpl::wrapText
          (MainImpl *this,Vector<char> *output,StringPtr indent,StringPtr text)

{
  RemoveConst<char> **ppRVar1;
  char *pcVar2;
  bool bVar3;
  size_t __n;
  ulong uVar4;
  char *pcVar5;
  void *pvVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  RemoveConst<char> *pRVar12;
  size_t newSize;
  size_t sVar13;
  uint uVar14;
  RemoveConst<char> *pRVar15;
  char *__s;
  size_t sVar16;
  
  sVar13 = text.content.size_;
  __s = text.content.ptr;
  pcVar10 = indent.content.ptr;
  sVar16 = sVar13 - 1;
  if (sVar16 != 0) {
    uVar8 = 0x51 - (int)indent.content.size_;
    __n = indent.content.size_ - 1;
    uVar4 = (ulong)uVar8;
    do {
      pcVar2 = (output->builder).ptr;
      pcVar5 = (output->builder).pos + (__n - (long)pcVar2);
      pcVar7 = (output->builder).endPtr;
      pcVar11 = pcVar7 + -(long)pcVar2;
      if (pcVar11 < pcVar5) {
        pcVar11 = (char *)((long)pcVar11 * 2);
        if (pcVar7 == pcVar2) {
          pcVar11 = (char *)0x4;
        }
        if (pcVar11 < pcVar5) {
          pcVar11 = pcVar5;
        }
        Vector<char>::setCapacity(output,(size_t)pcVar11);
      }
      pRVar15 = (output->builder).pos;
      if (pcVar10 + (indent.content.size_ - 1) != pcVar10) {
        memcpy(pRVar15,pcVar10,__n);
        pRVar15 = pRVar15 + __n;
      }
      (output->builder).pos = pRVar15;
      pvVar6 = memchr(__s,10,sVar16);
      uVar9 = (long)pvVar6 - (long)__s;
      if (pvVar6 == (void *)0x0) {
        bVar3 = true;
      }
      else {
        bVar3 = uVar4 < uVar9;
        if (uVar9 <= uVar4) {
          pcVar2 = (output->builder).ptr;
          pcVar7 = (output->builder).endPtr;
          pRVar15 = pRVar15 + ((uVar9 + 1) - (long)pcVar2);
          pRVar12 = pcVar7 + -(long)pcVar2;
          if (pRVar12 < pRVar15) {
            pRVar12 = (RemoveConst<char> *)((long)pRVar12 * 2);
            if (pcVar7 == pcVar2) {
              pRVar12 = (RemoveConst<char> *)0x4;
            }
            if (pRVar12 < pRVar15) {
              pRVar12 = pRVar15;
            }
            Vector<char>::setCapacity(output,(size_t)pRVar12);
          }
          pRVar15 = (output->builder).pos;
          sVar16 = uVar9 + 1;
          if (sVar16 != 0) {
            memcpy(pRVar15,__s,sVar16);
            pRVar15 = pRVar15 + sVar16;
          }
          (output->builder).pos = pRVar15;
          __s = __s + uVar9 + 1;
          sVar13 = sVar13 - sVar16;
        }
      }
      if (bVar3) {
        uVar9 = sVar13 - 1;
        if (uVar9 <= uVar4) {
          pcVar10 = (output->builder).ptr;
          pcVar7 = (output->builder).pos + (sVar13 - (long)pcVar10) + -1;
          pcVar2 = (output->builder).endPtr;
          pcVar11 = pcVar2 + -(long)pcVar10;
          if (pcVar11 < pcVar7) {
            pcVar5 = (char *)0x4;
            if (pcVar2 != pcVar10) {
              pcVar5 = (char *)((long)pcVar11 * 2);
            }
            if (pcVar5 < pcVar7) {
              pcVar5 = pcVar7;
            }
            Vector<char>::setCapacity(output,(size_t)pcVar5);
          }
          pRVar15 = (output->builder).pos;
          if (__s != __s + (sVar13 - 1)) {
            memcpy(pRVar15,__s,uVar9);
            pRVar15 = pRVar15 + uVar9;
          }
          (output->builder).pos = pRVar15;
          pRVar12 = (output->builder).endPtr;
          if (pRVar15 == pRVar12) {
            pRVar15 = (output->builder).ptr;
            sVar13 = 4;
            if (pRVar12 != pRVar15) {
              sVar13 = ((long)pRVar12 - (long)pRVar15) * 2;
            }
            Vector<char>::setCapacity(output,sVar13);
          }
          *(output->builder).pos = '\n';
          ppRVar1 = &(output->builder).pos;
          *ppRVar1 = *ppRVar1 + 1;
          return;
        }
        sVar16 = (size_t)uVar8;
        uVar9 = uVar4;
        if ((int)indent.content.size_ != 0x51) {
          do {
            if ((__s[uVar9] == ' ') && (__s[uVar9 - 1] != ' ')) {
              sVar16 = uVar9 & 0xffffffff;
              goto LAB_001b97b7;
            }
            uVar9 = uVar9 - 1;
          } while ((int)uVar9 != 0);
          sVar16 = (size_t)uVar8;
        }
LAB_001b97b7:
        pcVar2 = (output->builder).ptr;
        pcVar5 = (output->builder).pos + (sVar16 - (long)pcVar2);
        pcVar7 = (output->builder).endPtr;
        pcVar11 = pcVar7 + -(long)pcVar2;
        if (pcVar11 < pcVar5) {
          pcVar11 = (char *)((long)pcVar11 * 2);
          if (pcVar7 == pcVar2) {
            pcVar11 = (char *)0x4;
          }
          if (pcVar11 < pcVar5) {
            pcVar11 = pcVar5;
          }
          Vector<char>::setCapacity(output,(size_t)pcVar11);
        }
        pRVar15 = (output->builder).pos;
        if ((int)sVar16 != 0) {
          memcpy(pRVar15,__s,sVar16);
          pRVar15 = pRVar15 + sVar16;
        }
        (output->builder).pos = pRVar15;
        pRVar12 = (output->builder).endPtr;
        if (pRVar15 == pRVar12) {
          pRVar15 = (output->builder).ptr;
          newSize = ((long)pRVar12 - (long)pRVar15) * 2;
          if (pRVar12 == pRVar15) {
            newSize = 4;
          }
          Vector<char>::setCapacity(output,newSize);
        }
        *(output->builder).pos = '\n';
        ppRVar1 = &(output->builder).pos;
        *ppRVar1 = *ppRVar1 + 1;
        do {
          pcVar2 = __s + sVar16;
          uVar14 = (int)sVar16 + 1;
          sVar16 = (size_t)uVar14;
        } while (*pcVar2 == ' ');
        uVar9 = (ulong)(((*pcVar2 == '\n') + uVar14) - 1);
        __s = __s + uVar9;
        sVar13 = sVar13 - uVar9;
      }
      sVar16 = sVar13 - 1;
    } while (sVar16 != 0);
  }
  return;
}

Assistant:

void MainBuilder::MainImpl::wrapText(Vector<char>& output, StringPtr indent, StringPtr text) {
  uint width = 80 - indent.size();

  while (text.size() > 0) {
    output.addAll(indent);

    KJ_IF_SOME(lineEnd, text.findFirst('\n')) {
      if (lineEnd <= width) {
        output.addAll(text.first(lineEnd + 1));
        text = text.slice(lineEnd + 1);
        continue;
      }
    }

    if (text.size() <= width) {
      output.addAll(text);
      output.add('\n');
      break;
    }

    uint wrapPos = width;
    for (;; wrapPos--) {
      if (wrapPos == 0) {
        // Hmm, no good place to break words.  Just break in the middle.
        wrapPos = width;
        break;
      } else if (text[wrapPos] == ' ' && text[wrapPos - 1] != ' ') {
        // This position is a space and is preceded by a non-space.  Wrap here.
        break;
      }
    }

    output.addAll(text.first(wrapPos));
    output.add('\n');

    // Skip spaces after the text that was printed.
    while (text[wrapPos] == ' ') {
      ++wrapPos;
    }
    if (text[wrapPos] == '\n') {
      // Huh, apparently there were a whole bunch of spaces at the end of the line followed by a
      // newline.  Skip the newline as well so we don't print a blank line.
      ++wrapPos;
    }
    text = text.slice(wrapPos);
  }
}